

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

void __thiscall notch::io::PlainTextNetworkWriter::save(PlainTextNetworkWriter *this,Net *net)

{
  ulong uVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  NetSpec netSpec;
  
  NetSpec::NetSpec(&netSpec,net);
  uVar1 = ((long)netSpec.layers.
                 super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)netSpec.layers.
                super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x60;
  poVar2 = std::operator<<(this->out,"net: ");
  poVar2 = std::operator<<(poVar2,(string *)&netSpec);
  std::operator<<(poVar2,"\n");
  std::operator<<(this->out,"format: 1.0\n");
  poVar2 = std::operator<<(this->out,"inputs: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(this->out,"outputs: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(this->out,"layers: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::operator<<(this->out,"%%\n");
  lVar4 = 0;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    save(this,(LayerSpec *)
              ((long)&((netSpec.layers.
                        super__Vector_base<notch::io::LayerSpec,_std::allocator<notch::io::LayerSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tag)._M_dataplus._M_p + lVar4));
    if (uVar3 < uVar1 - 1) {
      std::operator<<(this->out,"%%\n");
    }
    lVar4 = lVar4 + 0x60;
  }
  NetSpec::~NetSpec(&netSpec);
  return;
}

Assistant:

void save(const Net &net) {
        auto netSpec = NetSpec(net);
        size_t n = netSpec.layers.size();
        out << "net: " << netSpec.tag << "\n";
        out << "format: 1.0\n"; // format version
        out << "inputs: " << netSpec.inputDim << "\n";
        out << "outputs: " << netSpec.outputDim << "\n";
        out << "layers: " << n << "\n";
        out << "%%\n";
        for (size_t i = 0; i < n; ++i) {
            save(netSpec.layers[i]);
            if (i < (n - 1)) {
                out << "%%\n";
            }
        }
    }